

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O2

TCPConnection * __thiscall ProtocolTCP::NewServer(ProtocolTCP *this,InterfaceMAC *mac,uint16_t port)

{
  long lVar1;
  long lVar2;
  
  lVar1 = -0x370;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x370 == 0x1130) {
      return (TCPConnection *)0x0;
    }
    lVar1 = lVar2 + 0x370;
  } while (*(int *)(&this->field_0x370 + lVar2) != 0);
  TCPConnection::Allocate((TCPConnection *)(&this->field_0x370 + lVar2),mac);
  *(undefined4 *)(&this->field_0x370 + lVar2) = 1;
  *(uint16_t *)(&this->field_0x374 + lVar2) = port;
  return (TCPConnection *)(&this->field_0x370 + lVar2);
}

Assistant:

TCPConnection* ProtocolTCP::NewServer(InterfaceMAC* mac, uint16_t port)
{
    int i;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        TCPConnection& connection = ConnectionList[i];
        if (connection.State == TCPConnection::CLOSED)
        {
            connection.Allocate(mac);
            connection.State = TCPConnection::LISTEN;
            connection.LocalPort = port;
            return &connection;
        }
    }

    return nullptr;
}